

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::PipelineLayout>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  Unique<vk::Handle<(vk::HandleType)16>_> obj0;
  Unique<vk::Handle<(vk::HandleType)16>_> obj2;
  Unique<vk::Handle<(vk::HandleType)16>_> obj1;
  Unique<vk::Handle<(vk::HandleType)16>_> obj3;
  Resources res;
  Environment env;
  VkPipelineLayout local_128;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_120;
  Move<vk::Handle<(vk::HandleType)16>_> local_108;
  Move<vk::Handle<(vk::HandleType)16>_> local_e8;
  Move<vk::Handle<(vk::HandleType)16>_> local_c8;
  Resources local_a8;
  Move<vk::Handle<(vk::HandleType)16>_> local_78;
  Environment local_58;
  
  local_58.vkp = context->m_platformInterface;
  local_58.vkd = Context::getDeviceInterface(context);
  local_58.device = Context::getDevice(context);
  local_58.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_58.programBinaries = context->m_progCollection;
  local_58.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_58.maxResourceConsumers = 4;
  PipelineLayout::Resources::Resources(&local_a8,&local_58,params);
  PipelineLayout::create(&local_e8,&local_58,&local_a8,params);
  DStack_120.m_device =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  DStack_120.m_allocator =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_128.m_internal =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  DStack_120.m_deviceIface =
       local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  PipelineLayout::create(&local_108,&local_58,&local_a8,params);
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  PipelineLayout::create(&local_c8,&local_58,&local_a8,params);
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  PipelineLayout::create(&local_78,&local_58,&local_a8,params);
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal;
  local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_deviceIface;
  if (local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               local_78.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  if (local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               local_108.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  if (local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal);
  }
  if (local_128.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_120,local_128);
  }
  local_128.m_internal = (deUint64)&DStack_120.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_128.m_internal,
             (undefined1 *)
             ((long)&(DStack_120.m_deviceIface)->_vptr_DeviceInterface + local_128.m_internal));
  if ((VkDevice *)local_128.m_internal != &DStack_120.m_device) {
    operator_delete((void *)local_128.m_internal,(ulong)(DStack_120.m_device + 1));
  }
  if (local_a8.pSetLayouts.
      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.pSetLayouts.
                    super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.pSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.pSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Dependency<vkt::api::(anonymous_namespace)::DescriptorSetLayout>_>_>_>
  ::~vector(&local_a8.descriptorSetLayouts);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}